

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O1

CordRepBtree * __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::
AddData<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
          (CordRepBtree *this,CordRepBtree *tree,string_view data,size_t extra)

{
  int *piVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  size_t sVar6;
  long lVar7;
  OpResult OVar8;
  OpResult OVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  string_view data_00;
  ulong uVar14;
  CordRepBtree *this_00;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *this_01;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *pSVar15;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *pSVar16;
  CordRepBtree *pCVar17;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *this_02;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *extra_00;
  long lVar18;
  Action AVar19;
  ulong uVar20;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *pSVar21;
  uint uVar22;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *pSVar23;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *pSVar24;
  undefined8 uVar25;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *unaff_R13;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *pSVar26;
  uint uVar27;
  bool bVar28;
  string_view sVar29;
  OpResult OVar30;
  OpResult OVar31;
  OpResult OVar32;
  OpResult OVar33;
  OpResult result;
  OpResult result_00;
  OpResult result_01;
  OpResult result_02;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> ops;
  StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *local_b8;
  char *local_a8;
  uint local_98 [2];
  long local_90 [12];
  
  extra_00 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *)
             data._M_str;
  sVar29._M_str = (char *)data._M_len;
  if (tree == (CordRepBtree *)0x0) {
    return this;
  }
  bVar2 = (this->super_CordRep).storage[0];
  pSVar26 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *)
            (ulong)bVar2;
  pSVar23 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *)0x0;
  pCVar17 = this;
  do {
    pSVar15 = pSVar26;
    if ((pSVar26 == pSVar23) ||
       (pSVar15 = pSVar23,
       (pCVar17->super_CordRep).refcount.count_.super___atomic_base<int>._M_i != 2)) {
      local_98[0] = (uint)((pCVar17->super_CordRep).refcount.count_.super___atomic_base<int>._M_i ==
                          2) + (int)pSVar15;
      pSVar23 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *)
                (ulong)local_98[0];
      uVar20 = (ulong)pSVar15 & 0xffffffff;
      uVar22 = (uint)bVar2;
      uVar14 = (ulong)pSVar15 & 0xffffffff;
      if ((int)pSVar15 <= (int)uVar22) {
        uVar14 = (ulong)uVar22;
      }
      goto LAB_004cfcdb;
    }
    local_90[(long)pSVar23] = (long)pCVar17;
    pSVar23 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *)
              ((long)&((CordRep *)&pSVar23->share_depth)->length + 1);
    pCVar17 = (CordRepBtree *)pCVar17->edges_[(pCVar17->super_CordRep).storage[1]];
  } while ((pCVar17->super_CordRep).tag == '\x03');
  goto LAB_004cfcf7;
  while( true ) {
    local_90[uVar20] = (long)pCVar17;
    uVar20 = uVar20 + 1;
    pCVar17 = (CordRepBtree *)pCVar17->edges_[(pCVar17->super_CordRep).storage[1]];
    if ((pCVar17->super_CordRep).tag != '\x03') break;
LAB_004cfcdb:
    if (uVar14 == uVar20) {
      this_01 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *)
                tree;
      pSVar15 = unaff_R13;
      local_b8 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *)
                 this;
      local_a8 = sVar29._M_str;
      if ((ulong)(pCVar17->super_CordRep).storage[2] - (ulong)(pCVar17->super_CordRep).storage[1] <
          6) {
        if ((int)uVar22 < (int)local_98[0]) {
          uVar25 = 0;
          this_00 = pCVar17;
        }
        else {
          sVar6 = (pCVar17->super_CordRep).length;
          this_00 = (CordRepBtree *)operator_new(0x40);
          (this_00->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
          (this_00->super_CordRep).length = sVar6;
          *(undefined4 *)((long)this_00->edges_ + 0x2c) =
               *(undefined4 *)((long)pCVar17->edges_ + 0x2c);
          uVar25 = *(undefined8 *)&(pCVar17->super_CordRep).tag;
          uVar10 = *(undefined8 *)((long)pCVar17->edges_ + 4);
          uVar11 = *(undefined8 *)((long)pCVar17->edges_ + 0xc);
          uVar12 = *(undefined8 *)((long)pCVar17->edges_ + 0x14);
          uVar13 = *(undefined8 *)((long)pCVar17->edges_ + 0x24);
          *(undefined8 *)((long)this_00->edges_ + 0x1c) =
               *(undefined8 *)((long)pCVar17->edges_ + 0x1c);
          *(undefined8 *)((long)this_00->edges_ + 0x24) = uVar13;
          *(undefined8 *)((long)this_00->edges_ + 0xc) = uVar11;
          *(undefined8 *)((long)this_00->edges_ + 0x14) = uVar12;
          *(undefined8 *)&(this_00->super_CordRep).tag = uVar25;
          *(undefined8 *)((long)this_00->edges_ + 4) = uVar10;
          bVar3 = (pCVar17->super_CordRep).storage[1];
          bVar4 = (pCVar17->super_CordRep).storage[2];
          if (bVar3 != bVar4) {
            lVar18 = (ulong)bVar3 << 3;
            do {
              lVar7 = *(long *)((long)pCVar17->edges_ + lVar18);
              if (lVar7 == 0) {
                __assert_fail("rep != nullptr",
                              "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                              ,0x391,"static CordRep *absl::cord_internal::CordRep::Ref(CordRep *)")
                ;
              }
              LOCK();
              piVar1 = (int *)(lVar7 + 8);
              *piVar1 = *piVar1 + 2;
              UNLOCK();
              lVar18 = lVar18 + 8;
            } while ((ulong)bVar4 * 8 != lVar18);
          }
          uVar25 = 1;
        }
        OVar31._8_8_ = uVar25;
        OVar31.tree = this_00;
        sVar29._M_len = (size_t)tree;
        pSVar23 = extra_00;
        sVar29 = AddData<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                           (this_00,sVar29,(size_t)extra_00);
        this_01 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *)
                  sVar29._M_len;
        local_a8 = sVar29._M_str;
        if (this_01 ==
            (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *)0x0) {
          (this_00->super_CordRep).length =
               (size_t)((tree->super_CordRep).storage + ((this_00->super_CordRep).length - 0xd));
          pSVar16 = pSVar26;
          if (pSVar26 ==
              (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *)0x0)
          {
LAB_004cff5e:
            result_00.tree = OVar31._8_8_;
            result_00._8_8_ = pSVar23;
            pSVar15 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                       *)cord_internal::anon_unknown_0::
                         StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                         ::Finalize((StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                                     *)this,OVar31.tree,result_00);
          }
          else {
            while( true ) {
              pCVar17 = OVar31.tree;
              uVar22 = (uint)pSVar16;
              uVar27 = uVar22 - 1;
              pSVar15 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                         *)local_90[(long)(int)uVar22 + -1];
              AVar19 = OVar31.action;
              pSVar23 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                         *)tree;
              if (AVar19 == kSelf) {
                *(uint8_t **)pSVar15 = (tree->super_CordRep).storage + *(long *)pSVar15 + -0xd;
                bVar28 = false;
                if (uVar22 < 2) {
                  pSVar16 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                             *)(ulong)uVar27;
                  OVar31._8_8_ = 0;
                  OVar31.tree = pCVar17;
                }
                else {
                  lVar18 = (ulong)uVar27 + 1;
                  do {
                    pSVar15 = *(StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                                **)(local_98 + lVar18 * 2 + -2);
                    *(uint8_t **)pSVar15 = (tree->super_CordRep).storage + *(long *)pSVar15 + -0xd;
                    lVar18 = lVar18 + -1;
                    uVar27 = uVar27 - 1;
                  } while (1 < lVar18);
                  bVar28 = false;
                  pSVar16 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                             *)(ulong)uVar27;
                  OVar31._8_8_ = 0;
                  OVar31.tree = pCVar17;
                }
              }
              else {
                bVar28 = true;
                pSVar23 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                           *)(ulong)local_98[0];
                if (AVar19 == kCopied) {
                  pSVar23 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                             *)tree;
                  OVar31 = SetEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                                     ((CordRepBtree *)pSVar15,(int)uVar22 <= (int)local_98[0],
                                      &pCVar17->super_CordRep,(size_t)tree);
                }
                else if (AVar19 == kPopped) {
                  pSVar23 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                             *)tree;
                  OVar31 = AddEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                                     ((CordRepBtree *)pSVar15,(int)uVar22 <= (int)local_98[0],
                                      &pCVar17->super_CordRep,(size_t)tree);
                }
                pSVar16 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                           *)(ulong)uVar27;
                pSVar15 = unaff_R13;
              }
              if (!bVar28) break;
              unaff_R13 = pSVar15;
              if ((int)pSVar16 < 1) goto LAB_004cff5e;
            }
          }
        }
        else {
          pSVar23 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *
                    )((long)tree - (long)this_01);
          if (pSVar23 ==
              (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *)0x0)
          {
            __assert_fail("delta > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                          ,0x279,
                          "static CordRepBtree *absl::cord_internal::CordRepBtree::AddData(CordRepBtree *, absl::string_view, size_t) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront]"
                         );
          }
          (this_00->super_CordRep).length =
               (long)&((CordRep *)((RefcountAndFlags *)pSVar23->stack + -2))->length +
               (this_00->super_CordRep).length;
          OVar30._8_8_ = uVar25;
          OVar30.tree = this_00;
          pSVar16 = pSVar26;
          if (pSVar26 ==
              (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *)0x0)
          {
LAB_004cfe88:
            result.tree = OVar30._8_8_;
            result._8_8_ = pSVar23;
            pSVar15 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                       *)cord_internal::anon_unknown_0::
                         StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                         ::Finalize((StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                                     *)this,OVar30.tree,result);
          }
          else {
            while( true ) {
              OVar30 = OVar31;
              pCVar17 = OVar30.tree;
              uVar22 = (uint)pSVar16;
              uVar27 = uVar22 - 1;
              pSVar15 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                         *)local_90[(long)(int)uVar22 + -1];
              AVar19 = OVar30.action;
              if (AVar19 == kSelf) {
                *(long *)pSVar15 =
                     (long)&((CordRep *)((RefcountAndFlags *)pSVar23->stack + -2))->length +
                     *(long *)pSVar15;
                bVar28 = false;
                if (uVar22 < 2) {
                  OVar30._8_8_ = 0;
                  OVar30.tree = pCVar17;
                }
                else {
                  lVar18 = (ulong)uVar27 + 1;
                  do {
                    pSVar15 = *(StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                                **)(local_98 + lVar18 * 2 + -2);
                    *(long *)pSVar15 =
                         (long)&((CordRep *)((RefcountAndFlags *)pSVar23->stack + -2))->length +
                         *(long *)pSVar15;
                    lVar18 = lVar18 + -1;
                    uVar27 = uVar27 - 1;
                  } while (1 < lVar18);
                  bVar28 = false;
                  OVar30._8_8_ = 0;
                  OVar30.tree = pCVar17;
                }
              }
              else {
                bVar28 = true;
                if (AVar19 == kCopied) {
                  OVar30 = SetEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                                     ((CordRepBtree *)pSVar15,(int)uVar22 <= (int)local_98[0],
                                      &pCVar17->super_CordRep,(size_t)pSVar23);
                  local_90[(long)(int)uVar22 + -1] = (long)OVar30.tree;
                  pSVar15 = unaff_R13;
                }
                else {
                  pSVar15 = unaff_R13;
                  if (AVar19 == kPopped) {
                    __assert_fail("!propagate",
                                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                                  ,0x145,
                                  "CordRepBtree *absl::cord_internal::(anonymous namespace)::StackOperations<absl::cord_internal::CordRepBtree::EdgeType::kFront>::Unwind(CordRepBtree *, int, size_t, OpResult) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront, propagate = true]"
                                 );
                  }
                }
              }
              if (!bVar28) break;
              pSVar16 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                         *)(ulong)uVar27;
              unaff_R13 = pSVar15;
              OVar31 = OVar30;
              if ((int)uVar27 < 1) goto LAB_004cfe88;
            }
          }
          local_98[0] = bVar2 + 1;
          this = (CordRepBtree *)pSVar15;
        }
        local_b8 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *)
                   this;
        if (this_01 ==
            (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *)0x0) {
          return (CordRepBtree *)pSVar15;
        }
      }
      do {
        data_00._M_str = (char *)extra_00;
        data_00._M_len = (size_t)local_a8;
        pCVar17 = NewLeaf<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                            ((CordRepBtree *)this_01,data_00,(size_t)pSVar23);
        pSVar16 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *)
                  (pCVar17->super_CordRep).length;
        pSVar24 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *)
                  ((long)this_01 - (long)pSVar16);
        if (pSVar24 ==
            (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *)0x0) {
          OVar8._8_8_ = 2;
          OVar8.tree = pCVar17;
          OVar32._8_8_ = 2;
          OVar32.tree = pCVar17;
          pSVar24 = pSVar26;
          if ((int)pSVar26 != 0) {
            do {
              pCVar17 = OVar32.tree;
              iVar5 = (int)pSVar24;
              pSVar23 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                         *)(ulong)(iVar5 - 1U);
              pSVar24 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                         *)local_90[(long)iVar5 + -1];
              AVar19 = OVar32.action;
              if (AVar19 == kSelf) {
                *(long *)pSVar24 =
                     (long)&((CordRep *)((RefcountAndFlags *)pSVar16->stack + -2))->length +
                     *(long *)pSVar24;
                bVar28 = false;
                if (iVar5 < 2) {
                  OVar32._8_8_ = 0;
                  OVar32.tree = pCVar17;
                  pSVar15 = pSVar24;
                }
                else {
                  lVar18 = (ulong)(iVar5 - 1U) + 1;
                  do {
                    pSVar15 = *(StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                                **)(local_98 + lVar18 * 2 + -2);
                    *(long *)pSVar15 =
                         (long)&((CordRep *)((RefcountAndFlags *)pSVar16->stack + -2))->length +
                         *(long *)pSVar15;
                    lVar18 = lVar18 + -1;
                    pSVar23 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                               *)(ulong)((int)pSVar23 - 1);
                  } while (1 < lVar18);
                  bVar28 = false;
                  OVar32._8_8_ = 0;
                  OVar32.tree = pCVar17;
                }
              }
              else {
                bVar28 = true;
                if (AVar19 == kCopied) {
                  OVar32 = SetEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                                     ((CordRepBtree *)pSVar24,iVar5 <= (int)local_98[0],
                                      &pCVar17->super_CordRep,(size_t)pSVar16);
                }
                else if (AVar19 == kPopped) {
                  OVar32 = AddEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                                     ((CordRepBtree *)pSVar24,iVar5 <= (int)local_98[0],
                                      &pCVar17->super_CordRep,(size_t)pSVar16);
                }
              }
              pSVar24 = this_01;
              this = (CordRepBtree *)pSVar23;
              if (!bVar28) goto LAB_004d0181;
              pSVar24 = pSVar23;
              OVar8 = OVar32;
            } while (0 < (int)pSVar23);
          }
          result_01.tree = OVar8._8_8_;
          result_01._8_8_ = pSVar23;
          pSVar15 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *
                    )cord_internal::anon_unknown_0::
                     StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>::
                     Finalize(local_b8,OVar8.tree,result_01);
          pSVar24 = this_01;
        }
        else {
          if (this_01 < pSVar24) {
            pSVar24 = this_01;
          }
          OVar9._8_8_ = 2;
          OVar9.tree = pCVar17;
          OVar33._8_8_ = 2;
          OVar33.tree = pCVar17;
          if ((int)pSVar26 != 0) {
            do {
              pCVar17 = OVar33.tree;
              iVar5 = (int)pSVar26;
              uVar22 = iVar5 - 1;
              pSVar23 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                         *)(long)iVar5;
              this_02 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                         *)local_90[(long)((long)pSVar23[-1].stack + 0x5f)];
              AVar19 = OVar33.action;
              if (AVar19 == kSelf) {
                *(long *)this_02 =
                     (long)&((CordRep *)((RefcountAndFlags *)pSVar16->stack + -2))->length +
                     *(long *)this_02;
                bVar28 = false;
                if (iVar5 < 2) {
                  pSVar26 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                             *)(ulong)uVar22;
                  OVar33._8_8_ = 0;
                  OVar33.tree = pCVar17;
                }
                else {
                  pSVar23 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                             *)((ulong)uVar22 + 1);
                  do {
                    this_02 = *(StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                                **)(local_98 + (long)pSVar23 * 2 + -2);
                    *(long *)this_02 =
                         (long)&((CordRep *)((RefcountAndFlags *)pSVar16->stack + -2))->length +
                         *(long *)this_02;
                    pSVar23 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                               *)((long)pSVar23[-1].stack + 0x5f);
                    uVar22 = uVar22 - 1;
                  } while (1 < (long)pSVar23);
                  bVar28 = false;
                  pSVar26 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                             *)(ulong)uVar22;
                  OVar33._8_8_ = 0;
                  OVar33.tree = pCVar17;
                }
              }
              else {
                bVar28 = true;
                pSVar23 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                           *)(ulong)local_98[0];
                if (AVar19 == kCopied) {
                  pSVar23 = pSVar16;
                  OVar33 = SetEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                                     ((CordRepBtree *)this_02,iVar5 <= (int)local_98[0],
                                      &pCVar17->super_CordRep,(size_t)pSVar16);
                }
                else if (AVar19 == kPopped) {
                  pSVar23 = pSVar16;
                  OVar33 = AddEdge<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                                     ((CordRepBtree *)this_02,iVar5 <= (int)local_98[0],
                                      &pCVar17->super_CordRep,(size_t)pSVar16);
                }
                pSVar26 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                           *)(ulong)uVar22;
                this_02 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                           *)this;
              }
              if (!bVar28) goto LAB_004d011e;
              this = (CordRepBtree *)this_02;
              OVar9 = OVar33;
            } while (0 < (int)pSVar26);
          }
          result_02.tree = OVar9._8_8_;
          result_02._8_8_ = pSVar23;
          this_02 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *
                    )cord_internal::anon_unknown_0::
                     StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>::
                     Finalize(local_b8,OVar9.tree,result_02);
LAB_004d011e:
          bVar2 = *(uint8_t *)((long)((RefcountAndFlags *)this_02->stack + 1) + 1);
          pSVar26 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *
                    )(ulong)bVar2;
          if (0xb < bVar2) {
            __assert_fail("height <= CordRepBtree::kMaxHeight",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                          ,0x103,
                          "void absl::cord_internal::(anonymous namespace)::StackOperations<absl::cord_internal::CordRepBtree::EdgeType::kFront>::BuildOwnedStack(CordRepBtree *, int) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront]"
                         );
          }
          pSVar23 = (StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0> *
                    )-(ulong)(uint)bVar2;
          lVar18 = 1;
          pSVar21 = this_02;
          while (iVar5 = (((RefcountAndFlags *)pSVar21->stack)->count_).super___atomic_base<int>.
                         _M_i,
                (long)&((CordRep *)((RefcountAndFlags *)pSVar23->stack + -2))->length + lVar18 != 1)
          {
            if (iVar5 != 2) {
              __assert_fail("tree->refcount.IsOne()",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                            ,0x106,
                            "void absl::cord_internal::(anonymous namespace)::StackOperations<absl::cord_internal::CordRepBtree::EdgeType::kFront>::BuildOwnedStack(CordRepBtree *, int) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront]"
                           );
            }
            local_90[lVar18 + -1] = (long)pSVar21;
            pSVar21 = *(StackOperations<(absl::lts_20250127::cord_internal::CordRepBtree::EdgeType)0>
                        **)((RefcountAndFlags *)pSVar21->stack +
                           (ulong)*(uint8_t *)((long)((RefcountAndFlags *)pSVar21->stack + 1) + 2) *
                           2 + 2);
            lVar18 = lVar18 + 1;
            if (*(uint8_t *)((RefcountAndFlags *)pSVar21->stack + 1) != '\x03') goto LAB_004cfcf7;
          }
          if (iVar5 != 2) {
            __assert_fail("tree->refcount.IsOne()",
                          "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                          ,0x10a,
                          "void absl::cord_internal::(anonymous namespace)::StackOperations<absl::cord_internal::CordRepBtree::EdgeType::kFront>::BuildOwnedStack(CordRepBtree *, int) [edge_type = absl::cord_internal::CordRepBtree::EdgeType::kFront]"
                         );
          }
          local_98[0] = (uint)lVar18;
          this = (CordRepBtree *)this_02;
          local_b8 = this_02;
        }
LAB_004d0181:
        bVar28 = this_01 == pSVar16;
        this_01 = pSVar24;
        if (bVar28) {
          return (CordRepBtree *)pSVar15;
        }
      } while( true );
    }
  }
LAB_004cfcf7:
  __assert_fail("IsBtree()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_btree.h"
                ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
}

Assistant:

CordRepBtree* CordRepBtree::AddData(CordRepBtree* tree, absl::string_view data,
                                    size_t extra) {
  if (ABSL_PREDICT_FALSE(data.empty())) return tree;

  const size_t original_data_size = data.size();
  int depth = tree->height();
  StackOperations<edge_type> ops;
  CordRepBtree* leaf = ops.BuildStack(tree, depth);

  // If there is capacity in the last edge, append as much data
  // as possible into this last edge.
  if (leaf->size() < leaf->capacity()) {
    OpResult result = leaf->ToOpResult(ops.owned(depth));
    data = result.tree->AddData<edge_type>(data, extra);
    if (data.empty()) {
      result.tree->length += original_data_size;
      return ops.Unwind(tree, depth, original_data_size, result);
    }

    // We added some data into this leaf, but not all. Propagate the added
    // length to the top most node, and rebuild the stack with any newly copied
    // or updated nodes. From this point on, the path (leg) from the top most
    // node to the right-most node towards the leaf node is privately owned.
    size_t delta = original_data_size - data.size();
    assert(delta > 0);
    result.tree->length += delta;
    tree = ops.Propagate(tree, depth, delta, result);
    ops.share_depth = depth + 1;
  }

  // We were unable to append all data into the existing right-most leaf node.
  // This means all remaining data must be put into (a) new leaf node(s) which
  // we append to the tree. To make this efficient, we iteratively build full
  // leaf nodes from `data` until the created leaf contains all remaining data.
  // We utilize the `Unwind` method to merge the created leaf into the first
  // level towards root that has capacity. On each iteration with remaining
  // data, we rebuild the stack in the knowledge that right-most nodes are
  // privately owned after the first `Unwind` completes.
  for (;;) {
    OpResult result = {CordRepBtree::NewLeaf<edge_type>(data, extra), kPopped};
    if (result.tree->length == data.size()) {
      return ops.Unwind(tree, depth, result.tree->length, result);
    }
    data = Consume<edge_type>(data, result.tree->length);
    tree = ops.Unwind(tree, depth, result.tree->length, result);
    depth = tree->height();
    ops.BuildOwnedStack(tree, depth);
  }
}